

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

string * kratos::strip_newline(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  long lVar2;
  
  while( true ) {
    lVar2 = std::__cxx11::string::find((char)str,10);
    if (lVar2 == -1) break;
    std::__cxx11::string::erase((ulong)str,1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string strip_newline(std::string &str) {
    std::string::size_type pos = 0;
    while ((pos = str.find('\n', pos) != std::string::npos)) str.erase(pos, 1);
    return str;
}